

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

string * tinyusdz::unescapeControlSequence(string *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_48;
  size_t i;
  string local_38 [8];
  string s;
  string *str_local;
  
  s.field_2._8_8_ = str;
  std::__cxx11::string::string(local_38);
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < 2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s.field_2._8_8_);
  }
  else {
    for (local_48 = 0; uVar1 = std::__cxx11::string::size(), local_48 < uVar1;
        local_48 = local_48 + 1) {
      pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
      if (*pcVar2 == '\\') {
        uVar1 = std::__cxx11::string::size();
        if (local_48 + 1 < uVar1) {
          pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
          if (*pcVar2 == 'a') {
            std::__cxx11::string::operator+=(local_38,'\a');
            local_48 = local_48 + 1;
          }
          else {
            pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
            if (*pcVar2 == 'b') {
              std::__cxx11::string::operator+=(local_38,'\b');
              local_48 = local_48 + 1;
            }
            else {
              pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
              if (*pcVar2 == 't') {
                std::__cxx11::string::operator+=(local_38,'\t');
                local_48 = local_48 + 1;
              }
              else {
                pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
                if (*pcVar2 == 'v') {
                  std::__cxx11::string::operator+=(local_38,'\v');
                  local_48 = local_48 + 1;
                }
                else {
                  pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
                  if (*pcVar2 == 'f') {
                    std::__cxx11::string::operator+=(local_38,'\f');
                    local_48 = local_48 + 1;
                  }
                  else {
                    pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
                    if (*pcVar2 == 'n') {
                      std::__cxx11::string::operator+=(local_38,'\n');
                      local_48 = local_48 + 1;
                    }
                    else {
                      pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
                      if (*pcVar2 == 'r') {
                        std::__cxx11::string::operator+=(local_38,'\r');
                        local_48 = local_48 + 1;
                      }
                      else {
                        pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
                        if (*pcVar2 == '\\') {
                          std::__cxx11::string::operator+=(local_38,"\\");
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
        std::__cxx11::string::operator+=(local_38,*pcVar2);
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_38);
  }
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string unescapeControlSequence(const std::string &str) {
  std::string s;

  if (str.size() < 2) {
    return str;
  }

  for (size_t i = 0; i < str.size(); i++) {
    if (str[i] == '\\') {
      if (i + 1 < str.size()) {
        if (str[i + 1] == 'a') {
          s += '\a';
          i++;
        } else if (str[i + 1] == 'b') {
          s += '\b';
          i++;
        } else if (str[i + 1] == 't') {
          s += '\t';
          i++;
        } else if (str[i + 1] == 'v') {
          s += '\v';
          i++;
        } else if (str[i + 1] == 'f') {
          s += '\f';
          i++;
        } else if (str[i + 1] == 'n') {
          s += '\n';
          i++;
        } else if (str[i + 1] == 'r') {
          s += '\r';
          i++;
        } else if (str[i + 1] == '\\') {
          s += "\\";
        } else {
          // ignore backslash
        }
      } else {
        // ignore backslash
      }
    } else {
      s += str[i];
    }
  }

  return s;
}